

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

size_t nhdp_domain_encode_mprtypes_tlvvalue(uint8_t *mprtypes,size_t mprtypes_size)

{
  size_t sVar1;
  list_entity *plVar2;
  
  plVar2 = &_domain_list;
  sVar1 = 0;
  do {
    plVar2 = plVar2->next;
    if (plVar2->prev == _domain_list.prev) {
      return sVar1;
    }
    mprtypes[sVar1] = *(uint8_t *)((long)&plVar2[-0x27].next + 1);
    sVar1 = sVar1 + 1;
  } while (mprtypes_size + (mprtypes_size == 0) != sVar1);
  return sVar1;
}

Assistant:

size_t
nhdp_domain_encode_mprtypes_tlvvalue(uint8_t *mprtypes, size_t mprtypes_size) {
  struct nhdp_domain *domain;
  size_t count;

  count = 0;
  list_for_each_element(&_domain_list, domain, _node) {
    mprtypes[count++] = domain->ext;

    if (count >= mprtypes_size) {
      break;
    }
  }

  return count;
}